

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O1

bool __thiscall QRectF::intersects(QRectF *this,QRectF *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = this->w;
  dVar2 = this->xp;
  dVar7 = dVar2 + dVar1;
  dVar6 = dVar7;
  if (0.0 <= dVar1) {
    dVar6 = dVar2;
  }
  if ((dVar7 != dVar2) || (NAN(dVar7) || NAN(dVar2))) {
    dVar3 = r->xp;
    dVar4 = r->w;
    dVar9 = dVar3 + dVar4;
    if ((dVar9 != dVar3) || (NAN(dVar9) || NAN(dVar3))) {
      dVar8 = dVar9;
      if (0.0 <= dVar4) {
        dVar8 = dVar3;
      }
      bVar5 = 0;
      if (((double)(~-(ulong)(dVar4 < 0.0) & (ulong)dVar9 | -(ulong)(dVar4 < 0.0) & (ulong)dVar3) <=
           dVar6) ||
         ((double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar7 | (ulong)dVar2 & -(ulong)(dVar1 < 0.0)) <=
          dVar8)) goto LAB_0038fda0;
      dVar1 = this->h;
      dVar2 = this->yp;
      dVar7 = dVar2 + dVar1;
      dVar6 = dVar7;
      if (0.0 <= dVar1) {
        dVar6 = dVar2;
      }
      if ((dVar7 != dVar2) || (NAN(dVar7) || NAN(dVar2))) {
        dVar3 = r->yp;
        dVar4 = r->h;
        dVar9 = dVar3 + dVar4;
        if ((dVar9 != dVar3) || (NAN(dVar9) || NAN(dVar3))) {
          dVar8 = dVar9;
          if (0.0 <= dVar4) {
            dVar8 = dVar3;
          }
          bVar5 = -(dVar8 < (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar7 |
                                    (ulong)dVar2 & -(ulong)(dVar1 < 0.0))) &
                  -(dVar6 < (double)(~-(ulong)(dVar4 < 0.0) & (ulong)dVar9 |
                                    -(ulong)(dVar4 < 0.0) & (ulong)dVar3));
          goto LAB_0038fda0;
        }
      }
    }
  }
  bVar5 = 0;
LAB_0038fda0:
  return (bool)(bVar5 & 1);
}

Assistant:

bool QRectF::intersects(const QRectF &r) const noexcept
{
    qreal l1 = xp;
    qreal r1 = xp;
    if (w < 0)
        l1 += w;
    else
        r1 += w;
    if (l1 == r1) // null rect
        return false;

    qreal l2 = r.xp;
    qreal r2 = r.xp;
    if (r.w < 0)
        l2 += r.w;
    else
        r2 += r.w;
    if (l2 == r2) // null rect
        return false;

    if (l1 >= r2 || l2 >= r1)
        return false;

    qreal t1 = yp;
    qreal b1 = yp;
    if (h < 0)
        t1 += h;
    else
        b1 += h;
    if (t1 == b1) // null rect
        return false;

    qreal t2 = r.yp;
    qreal b2 = r.yp;
    if (r.h < 0)
        t2 += r.h;
    else
        b2 += r.h;
    if (t2 == b2) // null rect
        return false;

    if (t1 >= b2 || t2 >= b1)
        return false;

    return true;
}